

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshmbuffer.c
# Opt level: O0

psize pp_shm_buffer_get_free_space(PShmBuffer *buf)

{
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  ppointer addr;
  psize write_pos;
  psize read_pos;
  PShmBuffer *buf_local;
  
  puVar3 = (ulong *)p_shm_get_address(buf->shm);
  uVar1 = *puVar3;
  uVar2 = puVar3[1];
  if (uVar2 < uVar1) {
    buf_local = (PShmBuffer *)((uVar1 - uVar2) + -1);
  }
  else if (uVar1 < uVar2) {
    buf_local = (PShmBuffer *)((buf->size - (uVar2 - uVar1)) + -1);
  }
  else {
    buf_local = (PShmBuffer *)(buf->size - 1);
  }
  return (psize)buf_local;
}

Assistant:

static psize
pp_shm_buffer_get_free_space (const PShmBuffer *buf)
{
	psize		read_pos;
	psize		write_pos;
	ppointer	addr;

	addr = p_shm_get_address (buf->shm);

	memcpy (&read_pos, (pchar *) addr + P_SHM_BUFFER_READ_OFFSET, sizeof (read_pos));
	memcpy (&write_pos, (pchar *) addr + P_SHM_BUFFER_WRITE_OFFSET, sizeof (write_pos));

	if (write_pos < read_pos)
		return read_pos - write_pos - 1;
	else if (write_pos > read_pos)
		return buf->size - (write_pos - read_pos) - 1;
	else
		return buf->size - 1;
}